

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastaParser.h
# Opt level: O2

unordered_set<std::string> *
parseFasta(unordered_set<std::string> *__return_storage_ptr__,string *fileName)

{
  istream *piVar1;
  ostream *poVar2;
  runtime_error *this;
  string seq_id;
  string line;
  string DNA_sequence;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  ifstream input;
  int aiStack_218 [122];
  
  __return_storage_ptr__->mHashMultiplier = 0xc4ceb9fe1a85ec53;
  __return_storage_ptr__->mKeyVals = (Node *)&__return_storage_ptr__->mMask;
  __return_storage_ptr__->mInfo = (uint8_t *)&__return_storage_ptr__->mMask;
  __return_storage_ptr__->mMaxNumElementsAllowed = 0;
  __return_storage_ptr__->mNumElements = 0;
  __return_storage_ptr__->mMask = 0;
  __return_storage_ptr__->mInfoInc = 0x20;
  __return_storage_ptr__->mInfoHashShift = 0;
  std::ifstream::ifstream(&input,(string *)fileName,_S_in);
  if (*(int *)((long)aiStack_218 + *(long *)(_input + -0x18)) == 0) {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    seq_id._M_dataplus._M_p = (pointer)&seq_id.field_2;
    DNA_sequence._M_dataplus._M_p = (pointer)&DNA_sequence.field_2;
    line._M_string_length = 0;
    seq_id._M_string_length = 0;
    DNA_sequence._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    seq_id.field_2._M_local_buf[0] = '\0';
    DNA_sequence.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&input,(string *)&line);
      if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
      if ((line._M_string_length != 0) && (*line._M_dataplus._M_p != ';')) {
        if (*line._M_dataplus._M_p == '>') {
          if (seq_id._M_string_length != 0) {
            robin_hood::detail::
            Table<true,80ul,std::__cxx11::string,void,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
            ::emplace<std::__cxx11::string_const&>
                      ((pair<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Iter<false>,_bool>
                        *)&local_258,
                       (Table<true,80ul,std::__cxx11::string,void,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                        *)__return_storage_ptr__,&DNA_sequence);
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_258,&line,1,0xffffffffffffffff);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&seq_id,&local_258);
          std::__cxx11::string::~string((string *)&local_258);
          DNA_sequence._M_string_length = 0;
          *DNA_sequence._M_dataplus._M_p = '\0';
        }
        else {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (&DNA_sequence,&line);
        }
      }
    }
    if (seq_id._M_string_length != 0) {
      robin_hood::detail::
      Table<true,80ul,std::__cxx11::string,void,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
      ::emplace<std::__cxx11::string_const&>
                ((pair<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Iter<false>,_bool>
                  *)&local_258,
                 (Table<true,80ul,std::__cxx11::string,void,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                  *)__return_storage_ptr__,&DNA_sequence);
    }
    std::__cxx11::string::~string((string *)&DNA_sequence);
    std::__cxx11::string::~string((string *)&seq_id);
    std::__cxx11::string::~string((string *)&line);
    std::ifstream::~ifstream(&input);
    return __return_storage_ptr__;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"[!] ");
  poVar2 = std::operator<<(poVar2,"Error opening: ");
  poVar2 = std::operator<<(poVar2,(string *)fileName);
  poVar2 = std::operator<<(poVar2,". ");
  std::endl<char,std::char_traits<char>>(poVar2);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&seq_id,"Error opening: ",fileName);
  std::operator+(&line,&seq_id," .");
  std::runtime_error::runtime_error(this,(string *)&line);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

robin_hood::unordered_set<std::string> parseFasta(const std::string &fileName) {
    /*
     * Parses a fasta file and returns a set of all sequences.
     */
    robin_hood::unordered_set<std::string> sequences = robin_hood::unordered_set<std::string>();
    std::ifstream input(fileName);
    if (!input.good()) {
        ERROR("Error opening: " << fileName << ". ");
        throw std::runtime_error("Error opening: " + fileName + " .");
    }
    std::string line, seq_id, DNA_sequence;

    while (std::getline(input, line)) {
        // line may be empty so you *must* ignore blank lines
        // or you have a crash waiting to happen with line[0]
        if (line.empty())
            continue;

        if (line[0] == '>') {
            // output previous line before overwriting seq_id
            // but ONLY if seq_id actually contains something
            if (!seq_id.empty())
                sequences.insert(DNA_sequence);
            seq_id = line.substr(1);
            DNA_sequence.clear();
        } else if (line[0] == ';') {
            //skip comment lines
            continue;
        } else {
            DNA_sequence += line;
        }
    }

    // output final entry ONLY if seq_id actually contains something
    if (!seq_id.empty())
        sequences.insert(DNA_sequence);
    return sequences;
}